

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.cc
# Opt level: O1

void GEN_CS::gen_cs_example_mtr(cb_to_cs_adf *c,multi_ex *ec_seq,label *cs_labels)

{
  pointer *pppeVar1;
  wclass *pwVar2;
  iterator __position;
  pointer ppeVar3;
  example **__args;
  long lVar4;
  ulong uVar5;
  wclass wc;
  undefined1 local_48 [24];
  
  c->action_sum =
       ((long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3) + c->action_sum;
  c->event_sum = c->event_sum + 1;
  ppeVar3 = (c->mtr_ec_seq).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((c->mtr_ec_seq).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppeVar3) {
    (c->mtr_ec_seq).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppeVar3;
  }
  v_array<COST_SENSITIVE::wclass>::clear(&cs_labels->costs);
  ppeVar3 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppeVar3) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      pwVar2 = (ppeVar3[uVar5]->l).cs.costs._begin;
      if ((long)(ppeVar3[uVar5]->l).cs.costs._end - (long)pwVar2 == 0x10) {
        local_48._0_4_ = pwVar2->x;
        if (((float)local_48._0_4_ != 3.4028235e+38) || (NAN((float)local_48._0_4_))) {
          local_48._4_12_ = SUB1612((undefined1  [16])0x0,4);
          c->mtr_example = (uint32_t)uVar5;
          __args = (example **)
                   ((long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>).
                          _M_impl.super__Vector_impl_data._M_start + lVar4);
          __position._M_current =
               (c->mtr_ec_seq).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (c->mtr_ec_seq).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<example*,std::allocator<example*>>::_M_realloc_insert<example*const&>
                      ((vector<example*,std::allocator<example*>> *)&c->mtr_ec_seq,__position,__args
                      );
          }
          else {
            *__position._M_current = *__args;
            pppeVar1 = &(c->mtr_ec_seq).super__Vector_base<example_*,_std::allocator<example_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            *pppeVar1 = *pppeVar1 + 1;
          }
          v_array<COST_SENSITIVE::wclass>::push_back(&cs_labels->costs,(wclass *)local_48);
        }
      }
      uVar5 = uVar5 + 1;
      ppeVar3 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 8;
    } while (uVar5 < (ulong)((long)(ec_seq->
                                   super__Vector_base<example_*,_std::allocator<example_*>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar3 >> 3));
  }
  return;
}

Assistant:

void gen_cs_example_mtr(cb_to_cs_adf& c, multi_ex& ec_seq, COST_SENSITIVE::label& cs_labels)
{
  c.action_sum += ec_seq.size();
  c.event_sum++;

  c.mtr_ec_seq.clear();
  cs_labels.costs.clear();
  for (size_t i = 0; i < ec_seq.size(); i++)
  {
    CB::label ld = ec_seq[i]->l.cb;

    COST_SENSITIVE::wclass wc = {0, 0, 0, 0};

    bool keep_example = false;
    if (ld.costs.size() == 1 && ld.costs[0].cost != FLT_MAX)
    {
      wc.x = ld.costs[0].cost;
      c.mtr_example = (uint32_t)i;
      keep_example = true;
    }
    if (keep_example)
    {
      c.mtr_ec_seq.push_back(ec_seq[i]);
      cs_labels.costs.push_back(wc);
    }
  }
}